

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O1

void wasm::
     CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>
     ::doStartTry(Flower *self,Expression **currp)

{
  pointer *ppvVar1;
  Expression *pEVar2;
  iterator __position;
  Expression *local_20;
  
  pEVar2 = *currp;
  if (pEVar2->_id == TryId) {
    __position._M_current =
         (self->
         super_CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>
         ).throwingInstsStack.
         super__Vector_base<std::vector<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (self->
        super_CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>
        ).throwingInstsStack.
        super__Vector_base<std::vector<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::vector<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*>_>_>_>
      ::_M_realloc_insert<>
                (&(self->
                  super_CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>
                  ).throwingInstsStack,__position);
    }
    else {
      ((__position._M_current)->
      super__Vector_base<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ((__position._M_current)->
      super__Vector_base<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ((__position._M_current)->
      super__Vector_base<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppvVar1 = &(self->
                 super_CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>
                 ).throwingInstsStack.
                 super__Vector_base<std::vector<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppvVar1 = *ppvVar1 + 1;
    }
    local_20 = pEVar2;
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
               &(self->
                super_CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>
                ).unwindExprStack,&local_20);
    return;
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                ,0x314,"T *wasm::Expression::cast() [T = wasm::Try]");
}

Assistant:

static void doStartTry(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<Try>();
    self->throwingInstsStack.emplace_back();
    self->unwindExprStack.push_back(curr);
  }